

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  ushort uVar8;
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar18;
  short sVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  short sVar23;
  
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)left;
  uVar1 = *(ulong *)above;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar7._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar13._9_6_ = 0;
  auVar13._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar11[0] = (char)(uVar1 >> 0x10);
  auVar14._11_4_ = 0;
  auVar14._0_11_ = auVar11;
  auVar12._1_12_ = SUB1512(auVar14 << 0x20,3);
  auVar12[0] = (char)(uVar1 >> 8);
  auVar17._0_2_ = CONCAT11(0,(byte)uVar1);
  auVar17._2_13_ = auVar12;
  auVar17[0xf] = 0;
  auVar19 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar20._0_4_ = auVar19._0_4_;
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  sVar18 = auVar19._0_2_;
  auVar22._0_2_ = auVar17._0_2_ - sVar18;
  sVar21 = auVar19._2_2_;
  auVar22._2_2_ = auVar12._0_2_ - sVar21;
  auVar22._4_2_ = auVar11._0_2_ - sVar18;
  sVar23 = (short)Var10;
  auVar22._6_2_ = sVar23 - sVar21;
  auVar22._8_2_ = auVar7._8_2_ - sVar18;
  auVar22._10_2_ = auVar5._10_2_ - sVar21;
  uVar8 = auVar2._13_2_ >> 8;
  auVar22._12_2_ = auVar3._12_2_ - sVar18;
  auVar22._14_2_ = uVar8 - sVar21;
  auVar24 = pabsw(in_XMM4,auVar22);
  iVar15 = 8;
  auVar19 = _DAT_004d48a0;
  do {
    auVar25 = pshufb(auVar16,auVar19);
    sVar26 = auVar22._0_2_ + auVar25._0_2_;
    sVar28 = auVar22._2_2_ + auVar25._2_2_;
    sVar29 = auVar22._4_2_ + auVar25._4_2_;
    sVar30 = auVar22._6_2_ + auVar25._6_2_;
    sVar31 = auVar22._8_2_ + auVar25._8_2_;
    sVar32 = auVar22._10_2_ + auVar25._10_2_;
    sVar33 = auVar22._12_2_ + auVar25._12_2_;
    sVar34 = auVar22._14_2_ + auVar25._14_2_;
    auVar35._0_2_ = sVar26 - auVar17._0_2_;
    auVar35._2_2_ = sVar28 - auVar12._0_2_;
    auVar35._4_2_ = sVar29 - auVar11._0_2_;
    auVar35._6_2_ = sVar30 - sVar23;
    auVar35._8_2_ = sVar31 - auVar7._8_2_;
    auVar35._10_2_ = sVar32 - auVar5._10_2_;
    auVar35._12_2_ = sVar33 - auVar3._12_2_;
    auVar35._14_2_ = sVar34 - uVar8;
    auVar35 = pabsw(auVar35,auVar35);
    auVar27._0_2_ = sVar26 - sVar18;
    auVar27._2_2_ = sVar28 - sVar21;
    auVar27._4_2_ = sVar29 - sVar18;
    auVar27._6_2_ = sVar30 - sVar21;
    auVar27._8_2_ = sVar31 - sVar18;
    auVar27._10_2_ = sVar32 - sVar21;
    auVar27._12_2_ = sVar33 - sVar18;
    auVar27._14_2_ = sVar34 - sVar21;
    auVar27 = pabsw(auVar27,auVar27);
    auVar37._0_2_ = -(ushort)(auVar35._0_2_ < auVar24._0_2_);
    auVar37._2_2_ = -(ushort)(auVar35._2_2_ < auVar24._2_2_);
    auVar37._4_2_ = -(ushort)(auVar35._4_2_ < auVar24._4_2_);
    auVar37._6_2_ = -(ushort)(auVar35._6_2_ < auVar24._6_2_);
    auVar37._8_2_ = -(ushort)(auVar35._8_2_ < auVar24._8_2_);
    auVar37._10_2_ = -(ushort)(auVar35._10_2_ < auVar24._10_2_);
    auVar37._12_2_ = -(ushort)(auVar35._12_2_ < auVar24._12_2_);
    auVar37._14_2_ = -(ushort)(auVar35._14_2_ < auVar24._14_2_);
    auVar38._0_2_ = -(ushort)(auVar27._0_2_ < auVar24._0_2_);
    auVar38._2_2_ = -(ushort)(auVar27._2_2_ < auVar24._2_2_);
    auVar38._4_2_ = -(ushort)(auVar27._4_2_ < auVar24._4_2_);
    auVar38._6_2_ = -(ushort)(auVar27._6_2_ < auVar24._6_2_);
    auVar38._8_2_ = -(ushort)(auVar27._8_2_ < auVar24._8_2_);
    auVar38._10_2_ = -(ushort)(auVar27._10_2_ < auVar24._10_2_);
    auVar38._12_2_ = -(ushort)(auVar27._12_2_ < auVar24._12_2_);
    auVar38._14_2_ = -(ushort)(auVar27._14_2_ < auVar24._14_2_);
    auVar36._0_2_ = -(ushort)(auVar27._0_2_ < auVar35._0_2_);
    auVar36._2_2_ = -(ushort)(auVar27._2_2_ < auVar35._2_2_);
    auVar36._4_2_ = -(ushort)(auVar27._4_2_ < auVar35._4_2_);
    auVar36._6_2_ = -(ushort)(auVar27._6_2_ < auVar35._6_2_);
    auVar36._8_2_ = -(ushort)(auVar27._8_2_ < auVar35._8_2_);
    auVar36._10_2_ = -(ushort)(auVar27._10_2_ < auVar35._10_2_);
    auVar36._12_2_ = -(ushort)(auVar27._12_2_ < auVar35._12_2_);
    auVar36._14_2_ = -(ushort)(auVar27._14_2_ < auVar35._14_2_);
    auVar25 = ~(auVar38 | auVar37) & auVar25 |
              (~auVar36 & auVar17 | auVar20 & auVar36) & (auVar38 | auVar37);
    sVar26 = auVar25._0_2_;
    sVar28 = auVar25._2_2_;
    sVar29 = auVar25._4_2_;
    sVar30 = auVar25._6_2_;
    sVar31 = auVar25._8_2_;
    sVar32 = auVar25._10_2_;
    sVar33 = auVar25._12_2_;
    sVar34 = auVar25._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar34) * (sVar34 < 0x100) * auVar25[0xe] - (0xff < sVar34),
                  CONCAT16((0 < sVar33) * (sVar33 < 0x100) * auVar25[0xc] - (0xff < sVar33),
                           CONCAT15((0 < sVar32) * (sVar32 < 0x100) * auVar25[10] - (0xff < sVar32),
                                    CONCAT14((0 < sVar31) * (sVar31 < 0x100) * auVar25[8] -
                                             (0xff < sVar31),
                                             CONCAT13((0 < sVar30) * (sVar30 < 0x100) * auVar25[6] -
                                                      (0xff < sVar30),
                                                      CONCAT12((0 < sVar29) * (sVar29 < 0x100) *
                                                               auVar25[4] - (0xff < sVar29),
                                                               CONCAT11((0 < sVar28) *
                                                                        (sVar28 < 0x100) *
                                                                        auVar25[2] - (0xff < sVar28)
                                                                        ,(0 < sVar26) *
                                                                         (sVar26 < 0x100) *
                                                                         auVar25[0] -
                                                                         (0xff < sVar26))))))));
    dst = dst + stride;
    auVar25._0_2_ = auVar19._0_2_ + 1;
    auVar25._2_2_ = auVar19._2_2_ + 1;
    auVar25._4_2_ = auVar19._4_2_ + 1;
    auVar25._6_2_ = auVar19._6_2_ + 1;
    auVar25._8_2_ = auVar19._8_2_ + 1;
    auVar25._10_2_ = auVar19._10_2_ + 1;
    auVar25._12_2_ = auVar19._12_2_ + 1;
    auVar25._14_2_ = auVar19._14_2_ + 1;
    iVar15 = iVar15 + -1;
    auVar19 = auVar25;
  } while (iVar15 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    _mm_storel_epi64((__m128i *)dst, _mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}